

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexParameterErrors
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  stringstream *log;
  GLint GVar1;
  bool bVar2;
  bool bVar3;
  GLuint depth;
  GLenum GVar4;
  pointer ppVar5;
  GLint value;
  int iStack_54;
  GLuint texture;
  GLint immutableFormat;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> params;
  
  log = &this->mLog;
  std::operator<<((ostream *)&this->field_0x88,"Verify TexParameter errors - ");
  gl4cts::Texture::Generate(gl,&texture);
  gl4cts::Texture::Bind(gl,texture,target);
  depth = SparseTextureUtils::getTargetDepth(target);
  gl4cts::Texture::Storage(gl,target,1,format,8,8,depth);
  GVar4 = (*gl->getError)();
  bVar2 = SparseTextureUtils::verifyError(log,"TexStorage",GVar4,0);
  if (bVar2) {
    (*gl->getTexParameteriv)(target,0x912f,&immutableFormat);
    GVar4 = (*gl->getError)();
    bVar2 = false;
    bVar3 = SparseTextureUtils::verifyQueryError(log,"getTexParameteriv",target,0x912f,GVar4,0);
    if ((bVar3) && (bVar2 = true, immutableFormat == 1)) {
      params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      value = 0x91a6;
      iStack_54 = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&params,
                 (pair<int,_int> *)&value);
      value = 0x91a7;
      iStack_54 = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&params,
                 (pair<int,_int> *)&value);
      bVar2 = true;
      for (ppVar5 = params.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppVar5 != params.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
        if (bVar2 != false) {
          (*gl->texParameteri)(target,ppVar5->first,ppVar5->second);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameteri",target,GVar1,GVar4,0x502);
        }
        if (bVar2 != false) {
          (*gl->texParameterf)(target,ppVar5->first,(float)ppVar5->second);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameterf",target,GVar1,GVar4,0x502);
        }
        if (bVar2 != false) {
          value = ppVar5->second;
          (*gl->texParameteriv)(target,ppVar5->first,&value);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameteriv",target,GVar1,GVar4,0x502);
        }
        if (bVar2 != false) {
          value = (GLint)(float)ppVar5->second;
          (*gl->texParameterfv)(target,ppVar5->first,(GLfloat *)&value);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameterfv",target,GVar1,GVar4,0x502);
        }
        if (bVar2 != false) {
          value = ppVar5->second;
          (*gl->texParameterIiv)(target,ppVar5->first,&value);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameterIiv",target,GVar1,GVar4,0x502);
        }
        if (bVar2 != false) {
          value = ppVar5->second;
          (*gl->texParameterIuiv)(target,ppVar5->first,(GLuint *)&value);
          GVar1 = ppVar5->first;
          GVar4 = (*gl->getError)();
          bVar2 = SparseTextureUtils::verifyQueryError
                            (log,"glTexParameterIuiv",target,GVar1,GVar4,0x502);
        }
      }
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&params.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    }
    gl4cts::Texture::Delete(gl,&texture);
  }
  else {
    gl4cts::Texture::Delete(gl,&texture);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexParameterErrors(const Functions& gl, GLint target, GLint format)
{
	mLog << "Verify TexParameter errors - ";

	bool result = true;

	GLuint texture;
	GLint  depth;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	depth = SparseTextureUtils::getTargetDepth(target);

	Texture::Storage(gl, target, 1, format, 8, 8, depth);
	if (!SparseTextureUtils::verifyError(mLog, "TexStorage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	GLint immutableFormat;

	gl.getTexParameteriv(target, GL_TEXTURE_IMMUTABLE_FORMAT, &immutableFormat);
	if (!SparseTextureUtils::verifyQueryError(mLog, "getTexParameteriv", target, GL_TEXTURE_IMMUTABLE_FORMAT,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	// Test error only if texture is immutable format, otherwise skip
	if (immutableFormat == GL_TRUE)
	{
		std::vector<IntPair> params;
		params.push_back(IntPair(GL_TEXTURE_SPARSE_ARB, GL_TRUE));
		params.push_back(IntPair(GL_VIRTUAL_PAGE_SIZE_INDEX_ARB, 1));

		for (std::vector<IntPair>::const_iterator iter = params.begin(); iter != params.end(); ++iter)
		{
			const IntPair& param = *iter;

			if (result)
			{
				gl.texParameteri(target, param.first, param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteri", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				gl.texParameterf(target, param.first, (GLfloat)param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterf", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameteriv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteriv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLfloat value = (GLfloat)param.second;
				gl.texParameterfv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterfv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameterIiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLuint value = param.second;
				gl.texParameterIuiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIuiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}
		}
	}

	Texture::Delete(gl, texture);
	return result;
}